

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

int32_t BinaryenConstGetValueI64Low(BinaryenExpressionRef expr)

{
  if (expr->_id != ConstId) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xacb,"int32_t BinaryenConstGetValueI64Low(BinaryenExpressionRef)");
  }
  if (*(long *)(expr + 2) == 3) {
    return *(int32_t *)(expr + 1);
  }
  __assert_fail("type == Type::i64",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x129,"int64_t wasm::Literal::geti64() const");
}

Assistant:

int32_t BinaryenConstGetValueI64Low(BinaryenExpressionRef expr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  return (int32_t)(static_cast<Const*>(expression)->value.geti64() &
                   0xffffffff);
}